

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz-test.cpp
# Opt level: O0

void __thiscall test_encode_decode_noise::test_method(test_encode_decode_noise *this)

{
  size_type *packet_callback;
  initializer_list<unsigned_char> __l;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  iterator iVar5;
  reference ppVar6;
  lazy_ostream *prev;
  undefined8 extraout_RDX;
  bool *__urng;
  result_type rVar7;
  result_type rVar8;
  complex<double> iq;
  basic_cstring<const_char> local_668;
  basic_cstring<const_char> local_658;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_648;
  assertion_result local_628;
  basic_cstring<const_char> local_610;
  basic_cstring<const_char> local_600;
  complex<double> local_5f0;
  pair<signed_char,_signed_char> local_5da;
  iterator iStack_5d8;
  pair<signed_char,_signed_char> pair;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  *__range1;
  normal_distribution<double> gaussian_noise;
  default_random_engine g;
  undefined1 local_588 [8];
  vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  complex_bytes1;
  encoder<signed_char> waver;
  undefined1 local_398 [8];
  demod_nrz zwave;
  anon_class_16_2_3216aafc wave_callback;
  bool called;
  value_type local_55 [16];
  allocator<unsigned_char> local_45;
  uchar local_44 [12];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  test_encode_decode_noise *this_local;
  
  local_44[0] = 0xd2;
  local_44[1] = 0xd6;
  local_44[2] = 0x33;
  local_44[3] = 0x22;
  local_44[4] = 0xaa;
  local_44[5] = 0x55;
  local_44[6] = 0xd;
  local_44[7] = 0xff;
  local_44[8] = 0;
  local_44[9] = 0xff;
  local_44[10] = 0;
  local_44[0xb] = 0x9f;
  local_38 = local_44;
  local_30 = 0xc;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_45);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,__l,&local_45);
  std::allocator<unsigned_char>::~allocator(&local_45);
  iVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  iVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  local_55[0] = wavingz::
                checksum<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )iVar4._M_current,
                           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )iVar5._M_current);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,local_55);
  wave_callback.buffer._7_1_ = 0;
  zwave.omega_c = (double)((long)&wave_callback.buffer + 7);
  wave_callback.called = (bool *)local_28;
  packet_callback = &waver.lp2.yv_m.m_size;
  std::function<void(unsigned_char*,unsigned_char*)>::
  function<test_encode_decode_noise::test_method()::__0&,void>
            ((function<void(unsigned_char*,unsigned_char*)> *)packet_callback,
             (anon_class_16_2_3216aafc *)&zwave.omega_c);
  wavingz::demod::demod_nrz::demod_nrz
            ((demod_nrz *)local_398,0x1f4000,
             (function<void_(unsigned_char_*,_unsigned_char_*)> *)packet_callback);
  std::function<void_(unsigned_char_*,_unsigned_char_*)>::~function
            ((function<void_(unsigned_char_*,_unsigned_char_*)> *)&waver.lp2.yv_m.m_size);
  wavingz::encoder<signed_char>::encoder
            ((encoder<signed_char> *)
             &complex_bytes1.
              super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,2000000,40000,100.0);
  iVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  iVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  wavingz::encoder<signed_char>::operator()
            ((vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
              *)local_588,
             (encoder<signed_char> *)
             &complex_bytes1.
              super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )iVar5._M_current,0.1);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &gaussian_noise._M_saved_available);
  std::normal_distribution<double>::normal_distribution
            ((normal_distribution<double> *)&__range1,0.0,1.0);
  __end1 = std::
           vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
           ::begin((vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
                    *)local_588);
  iStack_5d8 = std::
               vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
               ::end((vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
                      *)local_588);
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffa28), bVar2) {
    ppVar6 = __gnu_cxx::
             __normal_iterator<std::pair<signed_char,_signed_char>_*,_std::vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>_>
             ::operator*(&__end1);
    local_5da = *ppVar6;
    rVar7 = std::normal_distribution<double>::operator()
                      ((normal_distribution<double> *)&__range1,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &gaussian_noise._M_saved_available);
    iVar3 = (int)local_5da.first;
    __urng = &gaussian_noise._M_saved_available;
    rVar8 = std::normal_distribution<double>::operator()
                      ((normal_distribution<double> *)&__range1,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       __urng);
    std::complex<double>::complex
              (&local_5f0,rVar7 * 0.1 + ((double)iVar3 * 0.9) / 127.0,
               rVar8 * 0.1 + ((double)(int)local_5da.second * 0.9) / 127.0);
    iq._M_value._8_8_ = extraout_RDX;
    iq._M_value._0_8_ = __urng;
    wavingz::demod::demod_nrz::operator()((demod_nrz *)local_398,iq);
    __gnu_cxx::
    __normal_iterator<std::pair<signed_char,_signed_char>_*,_std::vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>_>
    ::operator++(&__end1);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_600,
               "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp"
               ,0x57);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_610);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_600,0x8f,&local_610);
    boost::test_tools::assertion_result::assertion_result
              (&local_628,(bool)(wave_callback.buffer._7_1_ & 1));
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_658,"called",6)
    ;
    boost::unit_test::operator<<(&local_648,prev,&local_658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_668,
               "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp"
               ,0x57);
    boost::test_tools::tt_detail::report_assertion(&local_628,&local_648,&local_668,0x8f,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_648);
    boost::test_tools::assertion_result::~assertion_result(&local_628);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  ::~vector((vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
             *)local_588);
  wavingz::encoder<signed_char>::~encoder
            ((encoder<signed_char> *)
             &complex_bytes1.
              super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  wavingz::demod::demod_nrz::~demod_nrz((demod_nrz *)local_398);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_encode_decode_noise)
{

    std::vector<uint8_t> buffer = { 0xd2, 0xd6, 0x33, 0x22, 0xAA, 0x55, 13, 0xFF, 0x00, 0xFF, 0x00, 0x9f };
    buffer.push_back(wavingz::checksum(buffer.begin(), buffer.end()));

    bool called = false;
    auto wave_callback = [&](uint8_t* begin, uint8_t* end)
    {
        called = true;
        BOOST_CHECK(end-begin >= 13); // we may have some more noisy bytes in the end
        BOOST_CHECK_EQUAL_COLLECTIONS(begin, begin+begin[6], buffer.begin(), buffer.end());
    };

    wavingz::demod::demod_nrz zwave(2048000, wave_callback);
    wavingz::encoder<int8_t> waver(2000000, 40000, 100);
    auto complex_bytes1 = waver(buffer.begin(), buffer.end(), 0.1);

    std::default_random_engine g;
    std::normal_distribution<double> gaussian_noise(0.0, 1.0);

    for(auto pair: complex_bytes1)
    {
        zwave(std::complex<double>(0.1 * gaussian_noise(g) + 0.9 * double(pair.first)/127.0,
                                   0.1 * gaussian_noise(g) + 0.9 * double(pair.second)/127.0));
    }
    BOOST_CHECK(called);
}